

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_sl_clip.h
# Opt level: O0

void __thiscall
agg::rasterizer_sl_clip<agg::ras_conv_int>::line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
          (rasterizer_sl_clip<agg::ras_conv_int> *this,rasterizer_cells_aa<agg::cell_aa> *ras,
          coord_type x1,coord_type y1,coord_type x2,coord_type y2,uint f1,uint f2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_38;
  int local_34;
  coord_type ty2;
  coord_type tx2;
  coord_type ty1;
  coord_type tx1;
  coord_type y2_local;
  coord_type x2_local;
  coord_type y1_local;
  coord_type x1_local;
  rasterizer_cells_aa<agg::cell_aa> *ras_local;
  rasterizer_sl_clip<agg::ras_conv_int> *this_local;
  
  if ((f1 & 10) == 0 && (f2 & 10) == 0) {
    iVar1 = ras_conv_int::xi(x1);
    iVar2 = ras_conv_int::yi(y1);
    iVar3 = ras_conv_int::xi(x2);
    iVar4 = ras_conv_int::yi(y2);
    rasterizer_cells_aa<agg::cell_aa>::line(ras,iVar1,iVar2,iVar3,iVar4);
  }
  else if ((f1 & 10) != (f2 & 10)) {
    ty2 = y1;
    tx2 = x1;
    if ((f1 & 8) != 0) {
      iVar1 = ras_conv_int::mul_div
                        ((double)((this->m_clip_box).y1 - y1),(double)(x2 - x1),(double)(y2 - y1));
      tx2 = x1 + iVar1;
      ty2 = (this->m_clip_box).y1;
    }
    if ((f1 & 2) != 0) {
      iVar1 = ras_conv_int::mul_div
                        ((double)((this->m_clip_box).y2 - y1),(double)(x2 - x1),(double)(y2 - y1));
      tx2 = x1 + iVar1;
      ty2 = (this->m_clip_box).y2;
    }
    local_38 = y2;
    local_34 = x2;
    if ((f2 & 8) != 0) {
      iVar1 = ras_conv_int::mul_div
                        ((double)((this->m_clip_box).y1 - y1),(double)(x2 - x1),(double)(y2 - y1));
      local_34 = x1 + iVar1;
      local_38 = (this->m_clip_box).y1;
    }
    if ((f2 & 2) != 0) {
      iVar1 = ras_conv_int::mul_div
                        ((double)((this->m_clip_box).y2 - y1),(double)(x2 - x1),(double)(y2 - y1));
      local_34 = x1 + iVar1;
      local_38 = (this->m_clip_box).y2;
    }
    iVar1 = ras_conv_int::xi(tx2);
    iVar2 = ras_conv_int::yi(ty2);
    iVar3 = ras_conv_int::xi(local_34);
    iVar4 = ras_conv_int::yi(local_38);
    rasterizer_cells_aa<agg::cell_aa>::line(ras,iVar1,iVar2,iVar3,iVar4);
  }
  return;
}

Assistant:

AGG_INLINE void line_clip_y(Rasterizer& ras,
                                    coord_type x1, coord_type y1, 
                                    coord_type x2, coord_type y2, 
                                    unsigned   f1, unsigned   f2) const
        {
            f1 &= 10;
            f2 &= 10;
            if((f1 | f2) == 0)
            {
                // Fully visible
                ras.line(Conv::xi(x1), Conv::yi(y1), Conv::xi(x2), Conv::yi(y2)); 
            }
            else
            {
                if(f1 == f2)
                {
                    // Invisible by Y
                    return;
                }

                coord_type tx1 = x1;
                coord_type ty1 = y1;
                coord_type tx2 = x2;
                coord_type ty2 = y2;

                if(f1 & 8) // y1 < clip.y1
                {
                    tx1 = x1 + Conv::mul_div(m_clip_box.y1-y1, x2-x1, y2-y1);
                    ty1 = m_clip_box.y1;
                }

                if(f1 & 2) // y1 > clip.y2
                {
                    tx1 = x1 + Conv::mul_div(m_clip_box.y2-y1, x2-x1, y2-y1);
                    ty1 = m_clip_box.y2;
                }

                if(f2 & 8) // y2 < clip.y1
                {
                    tx2 = x1 + Conv::mul_div(m_clip_box.y1-y1, x2-x1, y2-y1);
                    ty2 = m_clip_box.y1;
                }

                if(f2 & 2) // y2 > clip.y2
                {
                    tx2 = x1 + Conv::mul_div(m_clip_box.y2-y1, x2-x1, y2-y1);
                    ty2 = m_clip_box.y2;
                }
                ras.line(Conv::xi(tx1), Conv::yi(ty1), 
                         Conv::xi(tx2), Conv::yi(ty2)); 
            }
        }